

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O1

void __thiscall Function::operator/=(Function *this,Function *add)

{
  Function *this_00;
  EVP_PKEY_CTX *in_RDX;
  
  if (this->eType == EMPTY) {
    copy(this,(EVP_PKEY_CTX *)add,in_RDX);
    return;
  }
  this_00 = (Function *)operator_new(400);
  Function(this_00,this);
  this->oLog = (ostream *)&std::cout;
  this->xSrc = (double *)0x0;
  this->xLeft = (Function *)0x0;
  this->xRight = (Function *)0x0;
  this->xPlus = (Function *)0x0;
  this->xTable = (Matrix *)0x0;
  this->xFunction = 0;
  *(undefined8 *)&this->field_0xd0 = 0;
  this->dValue = 0.0;
  this->dLastValue = 0.0;
  this->dXMin = -10.0;
  this->dXMax = 10.0;
  this->dXStep = 0.1;
  this->dYMin = -10.0;
  this->dYMax = 10.0;
  this->dYStep = 0.1;
  this->bValueValid = false;
  this->bVerbose = false;
  this->functionUseCount = 0;
  this->eType = EMPTY;
  this->dXInput = 0.0;
  this->dNextXInput = 0.0;
  this->dYInput = 0.0;
  this->dNextYInput = 0.0;
  this->xLeft = this_00;
  this->xRight = add;
  setType(this,OVER);
  return;
}

Assistant:

void Function::operator/=( Function &add )
{
	if (eType==EMPTY)
		copy(add);
	else {
		Function *clone = new Function(*this);
		init();
		xLeft = clone;
		xRight = &add;
		setType(OVER);
	}
}